

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O0

void dCopy_CompCol_Matrix(SuperMatrix *A,SuperMatrix *B)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int local_34;
  int i;
  int nnz;
  int ncol;
  NCformat *Bstore;
  NCformat *Astore;
  SuperMatrix *B_local;
  SuperMatrix *A_local;
  
  B->Stype = A->Stype;
  B->Dtype = A->Dtype;
  B->Mtype = A->Mtype;
  B->nrow = A->nrow;
  iVar1 = A->ncol;
  B->ncol = iVar1;
  piVar3 = (int *)A->Store;
  piVar4 = (int *)B->Store;
  iVar2 = *piVar3;
  *piVar4 = iVar2;
  for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
    *(undefined8 *)(*(long *)(piVar4 + 2) + (long)local_34 * 8) =
         *(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_34 * 8);
  }
  for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
    *(undefined4 *)(*(long *)(piVar4 + 4) + (long)local_34 * 4) =
         *(undefined4 *)(*(long *)(piVar3 + 4) + (long)local_34 * 4);
  }
  for (local_34 = 0; local_34 <= iVar1; local_34 = local_34 + 1) {
    *(undefined4 *)(*(long *)(piVar4 + 6) + (long)local_34 * 4) =
         *(undefined4 *)(*(long *)(piVar3 + 6) + (long)local_34 * 4);
  }
  return;
}

Assistant:

void
dCopy_CompCol_Matrix(SuperMatrix *A, SuperMatrix *B)
{
    NCformat *Astore, *Bstore;
    int      ncol, nnz, i;

    B->Stype = A->Stype;
    B->Dtype = A->Dtype;
    B->Mtype = A->Mtype;
    B->nrow  = A->nrow;;
    B->ncol  = ncol = A->ncol;
    Astore   = (NCformat *) A->Store;
    Bstore   = (NCformat *) B->Store;
    Bstore->nnz = nnz = Astore->nnz;
    for (i = 0; i < nnz; ++i)
	((double *)Bstore->nzval)[i] = ((double *)Astore->nzval)[i];
    for (i = 0; i < nnz; ++i) Bstore->rowind[i] = Astore->rowind[i];
    for (i = 0; i <= ncol; ++i) Bstore->colptr[i] = Astore->colptr[i];
}